

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureTheFlag.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_4347a::CtfBase::reset(CtfBase *this)

{
  long lVar1;
  undefined1 auVar2 [16];
  int iVar3;
  long *plVar4;
  float extraout_XMM0_Da;
  undefined8 extraout_XMM0_Qa;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar5 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  Vec3 VVar13;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  OpenSteer::SimpleVehicle::reset(&this->super_SimpleVehicle);
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x1c])(this);
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x1f])(this);
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x21])(this);
  this->avoiding = false;
  do {
    iVar3 = rand();
    VVar13 = OpenSteer::RandomVectorInUnitRadiusSphere();
    fVar8 = VVar13.z;
    auVar6._0_8_ = VVar13._0_8_;
    auVar5._0_4_ = VVar13.x;
    fVar9 = SQRT(fVar8 * fVar8 + auVar5._0_4_ * auVar5._0_4_ + 0.0);
    if (0.0 < fVar9) {
      fVar8 = fVar8 / fVar9;
      auVar6._8_4_ = VVar13.y;
      auVar6._12_4_ = extraout_XMM0_Dd;
      auVar5._8_8_ = auVar6._8_8_;
      auVar5._4_4_ = 0;
      auVar7._0_12_ = auVar5._0_12_;
      auVar7._12_4_ = 0;
      auVar2._4_4_ = fVar9;
      auVar2._0_4_ = fVar9;
      auVar2._8_4_ = fVar9;
      auVar2._12_4_ = fVar9;
      divps(auVar7,auVar2);
    }
    fVar8 = fVar8 * ((float)iVar3 * 4.656613e-10 * 10.0 + 30.0) + DAT_0017b020;
    (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[9])(this);
    (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(this);
    fVar9 = 3.4028235e+38;
    if ((anonymous_namespace)::CtfBase::allObstacles != DAT_0017b060) {
      fVar9 = 3.4028235e+38;
      plVar4 = (anonymous_namespace)::CtfBase::allObstacles;
      do {
        lVar1 = *plVar4;
        fVar10 = (float)extraout_XMM0_Qa - *(float *)(lVar1 + 0x10);
        fVar11 = (float)((ulong)extraout_XMM0_Qa >> 0x20) - *(float *)(lVar1 + 0x14);
        fVar12 = fVar8 - *(float *)(lVar1 + 0x18);
        fVar10 = SQRT(fVar12 * fVar12 + fVar10 * fVar10 + fVar11 * fVar11) -
                 (*(float *)(lVar1 + 0xc) + 0.0);
        if (fVar9 <= fVar10) {
          fVar10 = fVar9;
        }
        fVar9 = fVar10;
        plVar4 = plVar4 + 1;
      } while (plVar4 != DAT_0017b060);
    }
    (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[0x18])(this);
  } while (fVar9 < extraout_XMM0_Da * 5.0);
  OpenSteer::SimpleVehicle::randomizeHeadingOnXZPlane(&this->super_SimpleVehicle);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  setTrailParameters((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
                     this,(this->super_SimpleVehicle).super_SimpleVehicle_3.
                          super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                          .trailDuration,
                     (this->super_SimpleVehicle).super_SimpleVehicle_3.
                     super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
                     trailVertexCount);
  return;
}

Assistant:

void CtfBase::reset (void)
    {
        SimpleVehicle::reset ();  // reset the vehicle 

        setSpeed (3);             // speed along Forward direction.
        setMaxForce (3.0);        // steering force is clipped to this magnitude
        setMaxSpeed (3.0);        // velocity is clipped to this magnitude

        avoiding = false;         // not actively avoiding

        randomizeStartingPositionAndHeading ();  // new starting position

        clearTrailHistory ();     // prevent long streaks due to teleportation
    }